

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PredicateSplitPassiveClauseContainers.cpp
# Opt level: O3

uint __thiscall
Saturation::PredicateSplitPassiveClauseContainer::sizeEstimate
          (PredicateSplitPassiveClauseContainer *this)

{
  pointer puVar1;
  uint uVar2;
  int iVar3;
  unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>
  *queue;
  pointer puVar4;
  
  if (this->_layeredArrangement == true) {
    uVar2 = (**(code **)(*(long *)&(((this->_queues).
                                     super__Vector_base<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
                                     super___uniq_ptr_impl<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_Saturation::PassiveClauseContainer_*,_std::default_delete<Saturation::PassiveClauseContainer>_>
                                     .
                                     super__Head_base<0UL,_Saturation::PassiveClauseContainer_*,_false>
                                    ._M_head_impl)->super_RandomAccessClauseContainer).
                                   super_ClauseContainer + 0x18))();
    return uVar2;
  }
  puVar1 = (this->_queues).
           super__Vector_base<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar2 = 0;
  for (puVar4 = (this->_queues).
                super__Vector_base<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar4 != puVar1; puVar4 = puVar4 + 1) {
    iVar3 = (**(code **)(*(long *)&(((puVar4->_M_t).
                                     super___uniq_ptr_impl<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_Saturation::PassiveClauseContainer_*,_std::default_delete<Saturation::PassiveClauseContainer>_>
                                     .
                                     super__Head_base<0UL,_Saturation::PassiveClauseContainer_*,_false>
                                    ._M_head_impl)->super_RandomAccessClauseContainer).
                                   super_ClauseContainer + 0x18))();
    uVar2 = uVar2 + iVar3;
  }
  return uVar2;
}

Assistant:

unsigned PredicateSplitPassiveClauseContainer::sizeEstimate() const
{ 
  ASS(!_queues.empty());

  if (_layeredArrangement)
  {
    // Note: If we use LRS, we lose the invariant that the last queue contains all clauses (since it can have stronger limits than the other queues).
    //       as a consequence the size of the last queue is only an estimate on the size.
    return _queues.back()->sizeEstimate();
  }
  else
  {
    unsigned sum = 0;
    for (const auto& queue : _queues)
    {
      sum += queue->sizeEstimate();
    }
    return sum;
  }
}